

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O2

void __thiscall BoolLinearLE<0>::BoolLinearLE(BoolLinearLE<0> *this,vec<BoolView> *_x,IntView<0> _y)

{
  IntVar *pIVar1;
  ulong uVar2;
  uint i;
  ulong uVar3;
  long lVar4;
  
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__BoolLinearLE_001f0040;
  vec<BoolView>::vec<BoolView>(&this->x,_x);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->ones).v = 0;
  (this->ps).sz = 0;
  (this->ps).cap = 0;
  (this->ps).data = (Lit *)0x0;
  lVar4 = 0;
  for (uVar3 = 0; uVar2 = (ulong)(this->x).sz, uVar3 < uVar2; uVar3 = uVar3 + 1) {
    BoolView::attach((BoolView *)
                     ((long)&(((this->x).data)->super_Var).super_Branching._vptr_Branching + lVar4),
                     &this->super_Propagator,(int)uVar3,2);
    lVar4 = lVar4 + 0x10;
  }
  pIVar1 = (this->y).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,uVar2,4);
  return;
}

Assistant:

BoolLinearLE(vec<BoolView>& _x, IntView<U> _y) : x(_x), y(_y), ones(0) {
		for (unsigned int i = 0; i < x.size(); i++) {
			x[i].attach(this, i, EVENT_L);
		}
		y.attach(this, x.size(), EVENT_U);
	}